

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendAlign.h
# Opt level: O3

int __thiscall
ExtendAlign<DNA>::Extend
          (ExtendAlign<DNA> *this,Sequence<DNA> *A,Sequence<DNA> *B,size_t *bestA,size_t *bestB,
          Cigar *cigar,AlignmentDirection dir,size_t startA,size_t startB)

{
  size_t sVar1;
  int iVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pCVar7;
  ulong uVar8;
  CigarOp CVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  size_t sVar15;
  int iVar16;
  ulong uVar17;
  CigarOp CVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  vector<CigarOp,_std::allocator<CigarOp>_> local_c8;
  Sequence<DNA> *local_a8;
  Sequence<DNA> *local_a0;
  size_t *local_98;
  ExtendAlign<DNA> *local_90;
  ulong local_88;
  int local_80;
  int local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  size_t *local_60;
  ulong local_58;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  int local_38;
  allocator_type local_32;
  byte local_31;
  
  sVar15 = (B->sequence)._M_string_length - startB;
  uVar13 = (A->sequence)._M_string_length - startA;
  if (dir != Forward) {
    sVar15 = startB;
    uVar13 = startA;
  }
  local_40 = uVar13 + 1;
  local_a8 = A;
  local_a0 = B;
  local_98 = bestA;
  local_60 = bestB;
  if ((ulong)((long)(this->mRow).
                    super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)(this->mRow).
                    super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) < local_40) {
    auVar25._8_4_ = (int)(local_40 >> 0x20);
    auVar25._0_8_ = local_40;
    auVar25._12_4_ = 0x45300000;
    dVar27 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0)) * 1.5;
    uVar8 = (ulong)dVar27;
    std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::vector
              ((vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_> *)&local_c8,
               (long)(dVar27 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8,&local_32);
    pCVar3 = (this->mRow).
             super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->mRow).super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->mRow).super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    (this->mRow).super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((pCVar3 != (pointer)0x0) &&
       (operator_delete(pCVar3),
       (CigarEntry)
       local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
       super__Vector_impl_data._M_start != (CigarEntry)0x0)) {
      operator_delete(local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  uVar8 = (sVar15 + 1) * local_40;
  if ((ulong)((long)(this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)(this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start) < uVar8) {
    auVar26._8_4_ = (int)(uVar8 >> 0x20);
    auVar26._0_8_ = uVar8;
    auVar26._12_4_ = 0x45300000;
    dVar27 = ((auVar26._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.5;
    uVar8 = (ulong)dVar27;
    std::vector<CigarOp,_std::allocator<CigarOp>_>::vector
              (&local_c8,(long)(dVar27 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8,
               (allocator_type *)&local_32);
    pCVar4 = (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((pCVar4 != (pointer)0x0) &&
       (operator_delete(pCVar4),
       (CigarEntry)
       local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
       super__Vector_impl_data._M_start != (CigarEntry)0x0)) {
      operator_delete(local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_98 != (size_t *)0x0) {
    *local_98 = startA;
  }
  if (local_60 != (size_t *)0x0) {
    *local_60 = startB;
  }
  pCVar3 = (this->mRow).
           super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar3->score = 0;
  local_38 = (this->mAP).gapExtendScore;
  uVar12 = (this->mAP).gapOpenScore + local_38;
  local_70 = (ulong)uVar12;
  pCVar3->scoreGap = uVar12;
  uVar8 = 1;
  if (1 < local_40) {
    iVar22 = (this->mAP).xDrop;
    pCVar4 = (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = 1;
    uVar23 = local_70;
    do {
      iVar16 = (int)uVar23;
      uVar8 = uVar17;
      if (iVar16 < -iVar22) break;
      pCVar4[uVar17] = Insertion;
      pCVar3[uVar17].score = iVar16;
      pCVar3[uVar17].scoreGap = -0x40000000;
      uVar23 = (ulong)(uint)(iVar16 + local_38);
      bVar24 = uVar17 != uVar13;
      uVar8 = local_40;
      uVar17 = uVar17 + 1;
    } while (bVar24);
  }
  local_90 = this;
  if (sVar15 + 1 < 2) {
    local_58 = 0;
    local_50 = 0;
    iVar22 = 0;
  }
  else {
    local_7c = (this->mAP).xDrop;
    pCVar4 = (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48 = 1;
    iVar22 = 0;
    local_50 = 0;
    local_58 = 0;
    uVar13 = local_40;
    uVar17 = 0;
    do {
      local_88 = uVar13;
      iVar16 = -0x40000000;
      local_78 = uVar17;
      local_68 = uVar17;
      if (uVar17 < uVar8) {
        pcVar5 = (local_a8->sequence)._M_dataplus._M_p;
        pcVar6 = (local_a0->sequence)._M_dataplus._M_p;
        local_80 = (this->mAP).xDrop;
        uVar13 = (startB - 1) + local_48;
        if (dir != Forward) {
          uVar13 = startB - local_48;
        }
        pCVar7 = (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar23 = startA - uVar17;
        iVar20 = -0x40000000;
        iVar21 = -0x40000000;
        iVar16 = -0x40000000;
        do {
          iVar2 = pCVar3[uVar17].scoreGap;
          if (uVar17 == 0) {
            uVar11 = 0;
            uVar19 = 0;
          }
          else {
            uVar11 = (startA - 1) + uVar17;
            if (dir != Forward) {
              uVar11 = uVar23;
            }
            if (((local_a8->sequence)._M_string_length <= uVar11) ||
               ((local_a0->sequence)._M_string_length <= uVar13)) {
              __assert_fail("index >= 0 && index < sequence.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Sequence.h"
                            ,0x32,
                            "char Sequence<DNA>::operator[](const size_t) const [Alphabet = DNA]");
            }
            local_31 = '\0' < "\n  Metagenomics tool for the rest of us.\n\n  Usage:\n    nsearch search --query=<queryfile> --db=<databasefile>\n      --out=<outputfile> --min-identity=<minidentity> [--max-hits=<maxaccepts>] [--max-rejects=<maxrejects>] [--protein] [--strand=<strand>]\n    nsearch merge --forward=<forwardfile> --reverse=<reversefile> --out=<outputfile>\n    nsearch filter --in=<inputfile> --out=<outputfile> [--max-expected-errors=<maxee>]\n\n  Options:\n    --min-identity=<minidentity>    Minimum identity threshold (e.g. 0.8).\n    --max-hits=<maxaccepts>         Maximum number of successful hits reported for one query [default: 1].\n    --max-rejects=<maxrejects>      Abort after this many candidates were rejected [default: 16].\n    --max-expected-errors=<maxee>   Maximum number of expected errors [default: 1.0].\n    --strand=<strand>               Strand to search on (plus, minus or both). If minus (or both), queries are reverse complemented [default: both].\n"
                              [(long)pcVar6[uVar13] + (long)pcVar5[uVar11] * 0x1a + 0x1d5];
            iVar21 = iVar20 + "\n  Metagenomics tool for the rest of us.\n\n  Usage:\n    nsearch search --query=<queryfile> --db=<databasefile>\n      --out=<outputfile> --min-identity=<minidentity> [--max-hits=<maxaccepts>] [--max-rejects=<maxrejects>] [--protein] [--strand=<strand>]\n    nsearch merge --forward=<forwardfile> --reverse=<reversefile> --out=<outputfile>\n    nsearch filter --in=<inputfile> --out=<outputfile> [--max-expected-errors=<maxee>]\n\n  Options:\n    --min-identity=<minidentity>    Minimum identity threshold (e.g. 0.8).\n    --max-hits=<maxaccepts>         Maximum number of successful hits reported for one query [default: 1].\n    --max-rejects=<maxrejects>      Abort after this many candidates were rejected [default: 16].\n    --max-expected-errors=<maxee>   Maximum number of expected errors [default: 1.0].\n    --strand=<strand>               Strand to search on (plus, minus or both). If minus (or both), queries are reverse complemented [default: both].\n"
                              [(long)pcVar6[uVar13] + (long)pcVar5[uVar11] * 0x1a + 0x1d5];
            uVar19 = uVar13;
          }
          iVar14 = iVar21;
          if (iVar21 <= iVar16) {
            iVar14 = iVar16;
          }
          iVar21 = iVar14;
          if (iVar14 <= iVar2) {
            iVar21 = iVar2;
          }
          iVar20 = pCVar3[uVar17].score;
          if (local_80 < iVar22 - iVar21) {
            pCVar3[uVar17].score = -0x40000000;
            local_78 = local_78 + (uVar17 == local_78);
          }
          else {
            if (iVar22 < iVar21) {
              if (local_98 != (size_t *)0x0) {
                *local_98 = uVar11;
              }
              local_50 = local_48;
              iVar22 = iVar21;
              local_58 = uVar17;
              if (local_60 != (size_t *)0x0) {
                *local_60 = uVar19;
              }
            }
            CVar9 = Match;
            if ((local_31 & 1) == 0) {
              CVar9 = Mismatch;
            }
            if (iVar14 <= iVar2) {
              CVar9 = Deletion;
            }
            CVar18 = Insertion;
            if (iVar21 != iVar16) {
              CVar18 = CVar9;
            }
            pCVar7[uVar17 + local_88] = CVar18;
            pCVar3[uVar17].score = iVar21;
            iVar10 = uVar12 + iVar21;
            iVar14 = iVar10;
            if (iVar10 <= iVar2 + local_38) {
              iVar14 = iVar2 + local_38;
            }
            pCVar3[uVar17].scoreGap = iVar14;
            iVar16 = iVar16 + local_38;
            local_68 = uVar17;
            if (iVar16 < iVar10) {
              iVar16 = iVar10;
            }
          }
          uVar17 = uVar17 + 1;
          uVar23 = uVar23 - 1;
        } while (uVar8 != uVar17);
      }
      if (local_78 == uVar8) break;
      if (local_68 < uVar8 - 1) {
        uVar8 = local_68 + 1;
      }
      else if ((iVar22 - local_7c <= iVar16) && (uVar8 < local_40)) {
        do {
          pCVar3[uVar8].score = iVar16;
          pCVar3[uVar8].scoreGap = uVar12 + iVar16;
          pCVar4[uVar8 + local_48 * local_40] = Insertion;
          iVar16 = iVar16 + local_38;
          uVar8 = uVar8 + 1;
          if (iVar16 < iVar22 - local_7c) break;
        } while (uVar8 < local_40);
      }
      if (uVar8 < local_40) {
        pCVar3[uVar8].score = -0x40000000;
        pCVar3[uVar8].scoreGap = -0x40000000;
        uVar8 = uVar8 + 1;
      }
      sVar1 = local_48 + 1;
      bVar24 = local_48 != sVar15;
      uVar13 = local_88 + local_40;
      uVar17 = local_78;
      local_48 = sVar1;
    } while (bVar24);
  }
  if (cigar != (Cigar *)0x0) {
    std::deque<CigarEntry,_std::allocator<CigarEntry>_>::clear
              (&cigar->super_deque<CigarEntry,_std::allocator<CigarEntry>_>);
    uVar13 = local_58;
    sVar15 = local_50;
    while (uVar13 != 0 || sVar15 != 0) {
      CVar9 = (local_90->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13 + sVar15 * local_40];
      local_c8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data
      ._M_start._0_5_ = CONCAT14(CVar9,1);
      Cigar::Add(cigar,(CigarEntry *)&local_c8);
      if (CVar9 < Insertion) {
        if (CVar9 == Match) {
LAB_001524c5:
          uVar13 = uVar13 - 1;
          sVar15 = sVar15 - 1;
        }
        else if (CVar9 == Deletion) {
          sVar15 = sVar15 - 1;
        }
      }
      else {
        if (CVar9 == Mismatch) goto LAB_001524c5;
        if (CVar9 == Insertion) {
          uVar13 = uVar13 - 1;
        }
      }
    }
    if (dir == Forward) {
      Cigar::Reverse(cigar);
    }
  }
  return iVar22;
}

Assistant:

int Extend( const Sequence< Alphabet >& A, const Sequence< Alphabet >& B,
              size_t* bestA = NULL, size_t* bestB = NULL, Cigar* cigar = NULL,
              const AlignmentDirection dir = AlignmentDirection::Forward,
              size_t startA = 0, size_t startB = 0 ) {
    int    score;
    size_t x, y;
    size_t aIdx, bIdx;
    size_t bestX, bestY;

    size_t width, height;

    if( dir == AlignmentDirection::Forward ) {
      width  = A.Length() - startA + 1;
      height = B.Length() - startB + 1;
    } else {
      width  = startA + 1;
      height = startB + 1;
    }

    if( mRow.capacity() < width ) {
      // Enlarge vector
      mRow = Cells( width * 1.5 );
    }

    if( mOperations.capacity() < width * height ) {
      mOperations = CigarOps( width * height * 1.5 );
    }

    bestX = 0;
    bestY = 0;

    if( bestA )
      *bestA = startA;
    if( bestB )
      *bestB = startB;

    int bestScore      = 0;
    mRow[ 0 ].score    = 0;
    mRow[ 0 ].scoreGap = mAP.gapOpenScore + mAP.gapExtendScore;

    for( x = 1; x < width; x++ ) {
      score = mAP.gapOpenScore + x * mAP.gapExtendScore;

      if( score < -mAP.xDrop )
        break;

      mOperations[ x ]   = CigarOp::Insertion;
      mRow[ x ].score    = score;
      mRow[ x ].scoreGap = MinInt();
    }
    size_t rowSize = x;
    /* Print( mRow ); */

    size_t firstX = 0;

    for( y = 1; y < height; y++ ) {

      int rowGap    = MinInt();
      int score     = MinInt();
      int diagScore = MinInt();

      size_t lastX = firstX;

      for( x = firstX; x < rowSize; x++ ) {
        int colGap = mRow[ x ].scoreGap;

        aIdx = 0;
        bIdx = 0;
        bool match;
        if( x > 0 ) {
          // diagScore: score at col-1, row-1

          if( dir == AlignmentDirection::Forward ) {
            aIdx = startA + x - 1;
            bIdx = startB + y - 1;
          } else {
            aIdx = startA - x;
            bIdx = startB - y;
          }

          /* printf( "x:%zu y:%zu %c == %c\n", x, y, A[ aIdx ], B[ bIdx ] ); */
          match = MatchPolicy< Alphabet >::Match( A[ aIdx ], B[ bIdx ] );
          score = diagScore + ScorePolicy< Alphabet >::Score( A[ aIdx ], B[ bIdx ] );
        }

        // select highest score
        //  - coming from diag (current),
        //  - coming from left (row)
        //  - coming from top (col)
        if( score < rowGap )
          score = rowGap;
        if( score < colGap )
          score = colGap;

        // mRow[ x ] right now points to the previous row, so use this
        // in the next iteration for the diagonal computation of (x, y )
        diagScore = mRow[ x ].score;

        if( bestScore - score > mAP.xDrop ) {
          // X-Drop test failed
          mRow[ x ].score = MinInt();

          if( x == firstX ) {
            // Tighten left bound
            firstX++;
          }
        } else {
          lastX = x;

          // Check if we achieved new highscore
          if( score > bestScore ) {
            bestScore = score;

            if( bestA )
              *bestA = aIdx;
            if( bestB )
              *bestB = bIdx;

            bestX = x;
            bestY = y;
          }

          // Record new score
          CigarOp op;
          if( score == rowGap ) {
            op = CigarOp::Insertion;
          } else if( score == colGap ) {
            op = CigarOp::Deletion;
          } else {
            op = match ? CigarOp::Match : CigarOp::Mismatch;
          }
          mOperations[ y * width + x ] = op;

          mRow[ x ].score = score;
          mRow[ x ].scoreGap =
            std::max( score + mAP.gapOpenScore + mAP.gapExtendScore,
                      colGap + mAP.gapExtendScore );
          rowGap = std::max( score + mAP.gapOpenScore + mAP.gapExtendScore,
                             rowGap + mAP.gapExtendScore );
        }
      }

      if( firstX == rowSize ) {
        // All cells failed the X-Drop test
        // We are done 8)
        break;
      }

      if( lastX < rowSize - 1 ) {
        // Tighten right bound
        rowSize = lastX + 1;
      } else {
        // Extend row, since last checked column didn't fail X-Drop test
        while( rowGap >= ( bestScore - mAP.xDrop ) && rowSize < width ) {
          mRow[ rowSize ].score = rowGap;
          mRow[ rowSize ].scoreGap =
            rowGap + mAP.gapOpenScore + mAP.gapExtendScore;
          mOperations[ y * width + rowSize ] = CigarOp::Insertion;
          rowGap += mAP.gapExtendScore;
          rowSize++;
        }
      }

      // Properly reset right bound
      if( rowSize < width ) {
        mRow[ rowSize ].score    = MinInt();
        mRow[ rowSize ].scoreGap = MinInt();
        rowSize++;
      }
      /* Print( mRow ); */
    }

    if( cigar ) {
      size_t bx = bestX;
      size_t by = bestY;

      CigarEntry ce;
      cigar->Clear();
      while( bx != 0 || by != 0 ) {
        CigarOp op = mOperations[ by * width + bx ];
        cigar->Add( op );

        switch( op ) {
          case CigarOp::Insertion:
            bx--;
            break;
          case CigarOp::Deletion:
            by--;
            break;
          case CigarOp::Match:
            bx--;
            by--;
            break;
          case CigarOp::Mismatch:
            bx--;
            by--;
            break;
          default:
            assert( true );
            break;
        }
      }

      if( dir == AlignmentDirection::Forward ) {
        cigar->Reverse();
      }
    }

    return bestScore;
  }